

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::writeImageSamplerDescriptorSet
          (ImageSampleComputeInstance *this,VkDescriptorSet descriptorSet)

{
  ShaderInputInterface SVar1;
  Location local_e8;
  VkDescriptorSet local_e0;
  Location local_d8;
  VkDescriptorSet local_d0;
  Location local_c8;
  VkDescriptorSet local_c0;
  Location local_b8;
  VkDescriptorSet local_b0;
  Location local_a8;
  VkDescriptorSet local_a0;
  deUint64 local_98;
  VkSampler local_90;
  deUint64 local_88;
  VkSampler local_80;
  undefined1 local_78 [8];
  VkDescriptorImageInfo imageSamplers [2];
  VkSampler samplers [2];
  undefined1 local_30 [8];
  VkDescriptorBufferInfo resultInfo;
  ImageSampleComputeInstance *this_local;
  VkDescriptorSet descriptorSet_local;
  
  resultInfo.range = (VkDeviceSize)this;
  samplers[1].m_internal = (deUint64)ComputeInstanceResultBuffer::getBuffer(&this->m_result);
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_30,(VkBuffer)samplers[1].m_internal,0,0x40);
  if (((this->m_isImmutableSampler & 1U) == 0) ||
     (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) {
    imageSamplers[1]._16_8_ = ImageSampleInstanceImages::getSamplerA(&this->m_images);
  }
  else {
    ::vk::Handle<(vk::HandleType)20>::Handle
              ((Handle<(vk::HandleType)20> *)&imageSamplers[1].imageLayout,0);
  }
  if (((this->m_isImmutableSampler & 1U) == 0) ||
     (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) {
    samplers[0] = ImageSampleInstanceImages::getSamplerB(&this->m_images);
  }
  else {
    ::vk::Handle<(vk::HandleType)20>::Handle(samplers,0);
  }
  local_80.m_internal = imageSamplers[1]._16_8_;
  local_88 = (deUint64)ImageSampleInstanceImages::getImageViewA(&this->m_images);
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_78,local_80,(VkImageView)local_88,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  local_90.m_internal = samplers[0].m_internal;
  local_98 = (deUint64)ImageSampleInstanceImages::getImageViewB(&this->m_images);
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)&imageSamplers[0].imageLayout,local_90,(VkImageView)local_98,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);
  local_a0.m_internal = descriptorSet.m_internal;
  local_a8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  ::vk::DescriptorSetUpdateBuilder::writeSingle
            (&this->m_updateBuilder,local_a0,&local_a8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
             (VkDescriptorBufferInfo *)local_30);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_b0.m_internal = descriptorSet.m_internal;
    local_b8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&this->m_updateBuilder,local_b0,&local_b8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
               (VkDescriptorImageInfo *)local_78);
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_c0.m_internal = descriptorSet.m_internal;
    local_c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&this->m_updateBuilder,local_c0,&local_c8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
               (VkDescriptorImageInfo *)local_78);
    local_d0.m_internal = descriptorSet.m_internal;
    local_d8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(2);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&this->m_updateBuilder,local_d0,&local_d8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
               (VkDescriptorImageInfo *)&imageSamplers[0].imageLayout);
  }
  else if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    local_e0.m_internal = descriptorSet.m_internal;
    local_e8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeArray
              (&this->m_updateBuilder,local_e0,&local_e8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,2
               ,(VkDescriptorImageInfo *)local_78);
  }
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(&this->m_updateBuilder,this->m_vki,this->m_device);
  }
  return;
}

Assistant:

void ImageSampleComputeInstance::writeImageSamplerDescriptorSet (vk::VkDescriptorSet descriptorSet)
{
	const vk::VkDescriptorBufferInfo	resultInfo			= vk::makeDescriptorBufferInfo(m_result.getBuffer(), 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkSampler					samplers[2]			=
	{
		(m_isImmutableSampler && (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) ? (0) : (m_images.getSamplerA()),
		(m_isImmutableSampler && (m_updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH)) ? (0) : (m_images.getSamplerB()),
	};
	const vk::VkDescriptorImageInfo		imageSamplers[2]	=
	{
		makeDescriptorImageInfo(samplers[0], m_images.getImageViewA(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
		makeDescriptorImageInfo(samplers[1], m_images.getImageViewB(), vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	};

	// result
	m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultInfo);

	// combined image samplers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[0]);
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(2u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageSamplers[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			m_updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 2u, imageSamplers);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		m_updateBuilder.update(m_vki, m_device);
	}
}